

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

int dump_to_fd(char *buffer,size_t size,void *data)

{
  int *dest;
  void *data_local;
  size_t size_local;
  char *buffer_local;
  
  return -1;
}

Assistant:

static int dump_to_fd(const char *buffer, size_t size, void *data)
{
	int *dest = (int *)data;
#ifdef HAVE_UNISTD_H
	if (write(*dest, buffer, size) == (ssize_t)size)
		return 0;
#endif
	return -1;
}